

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

TidyMessageImpl *
formatStandard(TidyDocImpl *doc,Node *element,Node *node,uint code,uint level,__va_list_tag *args)

{
  uint uVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  TidyMessageImpl *pTVar5;
  long *plVar6;
  uint *puVar7;
  ctmbstr ptVar8;
  undefined8 *puVar9;
  ulong uVar10;
  char *pcVar11;
  TidyDocImpl *pTVar12;
  Node *node_00;
  uint messageType;
  tmbstr ptVar13;
  ctmbstr ptVar14;
  char nodedesc [256];
  char elemdesc [256];
  char local_238 [256];
  char local_138 [264];
  
  memset(local_238,0,0x100);
  memset(local_138,0,0x100);
  TagToString(node,local_238,0x100);
  node_00 = node;
  if (element != (Node *)0x0) {
    TagToString(element,local_138,0x100);
    node_00 = element;
  }
  switch(code) {
  case 0x222:
  case 0x22d:
  case 0x264:
  case 0x270:
  case 0x271:
  case 0x28b:
  case 0x28c:
    ptVar13 = local_238;
    goto LAB_00151cfc;
  default:
    goto switchD_00151be4_caseD_223;
  case 0x225:
  case 0x25f:
  case 0x260:
  case 0x282:
  case 0x28d:
    uVar1 = args->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      plVar6 = (long *)((ulong)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      plVar6 = (long *)args->overflow_arg_area;
      args->overflow_arg_area = plVar6 + 1;
    }
    pcVar11 = "NULL";
    if ((char *)*plVar6 != (char *)0x0) {
      pcVar11 = (char *)*plVar6;
    }
    pTVar5 = prvTidytidyMessageCreateWithLexer(doc,code,level,pcVar11);
    break;
  case 0x22c:
  case 0x233:
  case 0x236:
  case 0x237:
  case 0x24f:
  case 0x250:
  case 0x251:
  case 0x252:
  case 0x253:
  case 600:
  case 0x262:
  case 0x265:
  case 0x27d:
  case 0x291:
    node = node_00;
    goto LAB_00151bef;
  case 0x22e:
  case 0x22f:
  case 0x230:
    uVar1 = args->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar7 = (uint *)((ulong)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      puVar7 = (uint *)args->overflow_arg_area;
      args->overflow_arg_area = puVar7 + 2;
    }
    uVar1 = *puVar7;
    uVar2 = args->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      puVar7 = (uint *)((ulong)uVar2 + (long)args->reg_save_area);
      args->gp_offset = uVar2 + 8;
    }
    else {
      puVar7 = (uint *)args->overflow_arg_area;
      args->overflow_arg_area = puVar7 + 2;
    }
    pTVar5 = prvTidytidyMessageCreateWithLexer(doc,code,level,(ulong)uVar1,(ulong)*puVar7);
    break;
  case 0x231:
  case 0x267:
  case 0x28e:
    ptVar13 = local_238;
    node_00 = node;
    goto LAB_00151cfc;
  case 0x232:
  case 0x268:
  case 0x27f:
    ptVar14 = node->element;
    node = node_00;
    ptVar8 = ptVar14;
    goto LAB_00151f6a;
  case 0x234:
    uVar10 = (doc->config).value[0x56].v - 1;
    messageType = 0x204;
    if (uVar10 < 3) {
      messageType = (int)uVar10 + 0x201;
    }
    ptVar8 = tidyLocalizedString(messageType);
    ptVar14 = local_138;
    code = 0x234;
    node = element;
    goto LAB_00151f6a;
  case 0x238:
  case 0x241:
  case 0x243:
  case 0x263:
  case 0x281:
  case 0x284:
    ptVar13 = local_138;
    goto LAB_00151cfc;
  case 0x239:
  case 0x23a:
    ptVar8 = HTMLVersion(doc);
    ptVar14 = local_238;
    goto LAB_00151f6a;
  case 0x23d:
  case 0x23e:
  case 0x23f:
  case 0x276:
  case 0x278:
  case 0x279:
  case 0x27a:
    uVar1 = args->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      pTVar5 = (TidyMessageImpl *)((ulong)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      pTVar5 = (TidyMessageImpl *)args->overflow_arg_area;
      args->overflow_arg_area = &pTVar5->tidyNode;
    }
    pTVar12 = pTVar5->tidyDoc;
    if (pTVar12 != (TidyDocImpl *)0x0) {
      pTVar5 = prvTidytidyMessageCreate(doc,code,level,pTVar12);
    }
    goto LAB_0015202a;
  case 0x247:
  case 0x261:
  case 0x280:
  case 0x285:
  case 0x287:
    ptVar13 = node->element;
    node_00 = node;
    goto LAB_00151cfc;
  case 599:
    uVar1 = args->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      pTVar5 = (TidyMessageImpl *)((ulong)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      pTVar5 = (TidyMessageImpl *)args->overflow_arg_area;
      args->overflow_arg_area = &pTVar5->tidyNode;
    }
    pTVar12 = pTVar5->tidyDoc;
    if (pTVar12 != (TidyDocImpl *)0x0) {
      pTVar5 = prvTidytidyMessageCreateWithNode(doc,node,599,level,local_238,pTVar12);
    }
    goto LAB_0015202a;
  case 0x259:
    ptVar14 = element->element;
    ptVar8 = local_238;
    code = 0x259;
    node = node_00;
    goto LAB_00151f6a;
  case 0x25a:
  case 0x25b:
  case 0x26d:
    ptVar13 = element->element;
LAB_00151cfc:
    pTVar5 = prvTidytidyMessageCreateWithNode(doc,node_00,code,level,ptVar13);
    break;
  case 0x269:
  case 0x273:
  case 0x274:
    ptVar14 = local_138;
    ptVar8 = local_238;
    node = node_00;
    goto LAB_00151f6a;
  case 0x26a:
  case 0x27c:
    uVar1 = args->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      pTVar5 = (TidyMessageImpl *)((ulong)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      pTVar5 = (TidyMessageImpl *)args->overflow_arg_area;
      args->overflow_arg_area = &pTVar5->tidyNode;
    }
    pTVar12 = pTVar5->tidyDoc;
    if (pTVar12 != (TidyDocImpl *)0x0) {
      pTVar5 = prvTidytidyMessageCreateWithLexer(doc,code,level,pTVar12);
    }
LAB_0015202a:
    if (pTVar12 == (TidyDocImpl *)0x0) {
switchD_00151be4_caseD_223:
      pTVar5 = (TidyMessageImpl *)0x0;
    }
    break;
  case 0x26b:
    uVar1 = args->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar9 = (undefined8 *)((ulong)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      puVar9 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = puVar9 + 1;
    }
    uVar3 = *puVar9;
    uVar1 = args->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar9 = (undefined8 *)((ulong)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      puVar9 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = puVar9 + 1;
    }
    uVar4 = *puVar9;
    uVar1 = args->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar9 = (undefined8 *)((ulong)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      puVar9 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = puVar9 + 1;
    }
    pTVar5 = prvTidytidyMessageCreateWithLexer(doc,0x26b,level,uVar3,uVar4,*puVar9);
    break;
  case 0x26c:
  case 0x277:
    uVar1 = args->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar9 = (undefined8 *)((ulong)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      puVar9 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = puVar9 + 1;
    }
    uVar3 = *puVar9;
    uVar1 = args->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar9 = (undefined8 *)((ulong)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      puVar9 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = puVar9 + 1;
    }
    pTVar5 = prvTidytidyMessageCreateWithLexer(doc,code,level,uVar3,*puVar9);
    break;
  case 0x275:
    code = 0x275;
LAB_00151bef:
    pTVar5 = prvTidytidyMessageCreateWithNode(doc,node,code,level);
    break;
  case 0x27b:
    pTVar5 = prvTidytidyMessageCreate(doc,0x27b,level);
    break;
  case 0x27e:
    ptVar8 = element->element;
    ptVar14 = local_238;
    code = 0x27e;
    goto LAB_00151f6a;
  case 0x286:
    ptVar14 = node->element;
    ptVar8 = element->element;
    code = 0x286;
LAB_00151f6a:
    pTVar5 = prvTidytidyMessageCreateWithNode(doc,node,code,level,ptVar14,ptVar8);
  }
  return pTVar5;
}

Assistant:

TidyMessageImpl *formatStandard(TidyDocImpl* doc, Node *element, Node *node, uint code, uint level, va_list args)
{
    char nodedesc[ 256 ] = {0};
    char elemdesc[ 256 ] = {0};
    Node* rpt = ( element ? element : node );

    TagToString(node, nodedesc, sizeof(nodedesc));

    if ( element )
        TagToString(element, elemdesc, sizeof(elemdesc));

    switch ( code )
    {
        case CUSTOM_TAG_DETECTED:
        {
            ctmbstr tagtype;
            switch ( cfg( doc, TidyUseCustomTags ) )
            {
                case TidyCustomBlocklevel:
                    tagtype = tidyLocalizedString( TIDYCUSTOMBLOCKLEVEL_STRING );
                    break;
                case TidyCustomEmpty:
                    tagtype = tidyLocalizedString( TIDYCUSTOMEMPTY_STRING );
                    break;
                case TidyCustomInline:
                    tagtype = tidyLocalizedString( TIDYCUSTOMINLINE_STRING );
                    break;
                case TidyCustomPre:
                default:
                    tagtype = tidyLocalizedString( TIDYCUSTOMPRE_STRING );
                    break;
            }
            return TY_(tidyMessageCreateWithNode)(doc, element, code, level, elemdesc, tagtype );
        }

        case STRING_NO_SYSID:
            return TY_(tidyMessageCreate)( doc, code, level );
            
        case FILE_CANT_OPEN:
        case FILE_CANT_OPEN_CFG:
        case FILE_NOT_FILE:
        case STRING_CONTENT_LOOKS:
        case STRING_DOCTYPE_GIVEN:
        case STRING_MISSING_MALFORMED:
        case STRING_MUTING_TYPE:
        {
            ctmbstr str;
            if ( (str = va_arg( args, ctmbstr)) )
                return TY_(tidyMessageCreate)( doc, code, level, str );

        } break;

        case APOS_UNDEFINED:
        case MISSING_SEMICOLON_NCR:
        case MISSING_SEMICOLON:
        case UNESCAPED_AMPERSAND:
        case UNKNOWN_ENTITY:
        {
            ctmbstr entityname;
            if ( !(entityname = va_arg( args, ctmbstr)) )
            {
                entityname = "NULL";
            }
            return TY_(tidyMessageCreateWithLexer)(doc, code, level, entityname);
        }

        case MISSING_ATTRIBUTE:
        {
            ctmbstr name;
            if ( (name = va_arg( args, ctmbstr)) )
                return TY_(tidyMessageCreateWithNode)(doc, node, code, level, nodedesc, name );
        } break;

        case STRING_UNKNOWN_OPTION:
        case OPTION_REMOVED:
        {
            ctmbstr str;
            if ( (str = va_arg( args, ctmbstr)) )
                return TY_(tidyMessageCreateWithLexer)(doc, code, level, str);
        } break;

        case OPTION_REMOVED_UNAPPLIED:
        case STRING_ARGUMENT_BAD:
        {
            ctmbstr s1 = va_arg( args, ctmbstr );
            ctmbstr s2 = va_arg( args, ctmbstr );
            return TY_(tidyMessageCreateWithLexer)(doc, code, level, s1, s2);
        }

        case OPTION_REMOVED_APPLIED:
        {
            ctmbstr s1 = va_arg( args, ctmbstr );
            ctmbstr s2 = va_arg( args, ctmbstr );
            ctmbstr s3 = va_arg( args, ctmbstr );
            return TY_(tidyMessageCreateWithLexer)(doc, code, level, s1, s2, s3);
        }


        case BAD_SURROGATE_LEAD:
        case BAD_SURROGATE_PAIR:
        case BAD_SURROGATE_TAIL:
        {
            uint c1 = va_arg( args, uint );
            uint c2 = va_arg( args, uint );
            return TY_(tidyMessageCreateWithLexer)(doc, code, level, c1, c2);
        }

        case SPACE_PRECEDING_XMLDECL:
            /* @TODO: Should this be a TidyInfo "silent" fix? */
            return TY_(tidyMessageCreateWithNode)(doc, node, code, level );

        case CANT_BE_NESTED:
        case NOFRAMES_CONTENT:
        case USING_BR_INPLACE_OF:
            /* Can we use `rpt` here? No; `element` has a value in every case. */
            return TY_(tidyMessageCreateWithNode)(doc, node, code, level, nodedesc );

        case ELEMENT_VERS_MISMATCH_ERROR:
        case ELEMENT_VERS_MISMATCH_WARN:
            return TY_(tidyMessageCreateWithNode)(doc, node, code, level, nodedesc, HTMLVersion(doc) );

        case TAG_NOT_ALLOWED_IN:
            /* Can we use `rpt` here? No; `element` has a value in every case. */
            return TY_(tidyMessageCreateWithNode)(doc, node, code, level, nodedesc, element->element );

        case INSERTING_TAG:
        case MISSING_STARTTAG:
        case TOO_MANY_ELEMENTS:
        case UNEXPECTED_ENDTAG:
        case UNEXPECTED_ENDTAG_ERR:  /* generated by XML docs */
            /* Can we use `rpt` here? No; `element` has a value in every case. */
            return TY_(tidyMessageCreateWithNode)(doc, node, code, level, node->element );

        case UNEXPECTED_ENDTAG_IN:
            /* Can we use `rpt` here? No; `element` has a value in every case. */
            return TY_(tidyMessageCreateWithNode)(doc, node, code, level, node->element, element->element );

        case BAD_CDATA_CONTENT:
        case CONTENT_AFTER_BODY:
        case DOCTYPE_AFTER_TAGS:
        case DUPLICATE_FRAMESET:
        case MALFORMED_COMMENT:
        case MALFORMED_COMMENT_DROPPING:
        case MALFORMED_COMMENT_EOS:
        case MALFORMED_COMMENT_WARN:
        case MALFORMED_DOCTYPE:
        case MISSING_DOCTYPE:
        case MISSING_TITLE_ELEMENT:
        case NESTED_QUOTATION:
        case SUSPECTED_MISSING_QUOTE:
        case XML_DECLARATION_DETECTED:
            return TY_(tidyMessageCreateWithNode)(doc, rpt, code, level );

        case ELEMENT_NOT_EMPTY:
        case FOUND_STYLE_IN_BODY:
        case ILLEGAL_NESTING:
        case MOVED_STYLE_TO_HEAD:
        case TRIM_EMPTY_ELEMENT:
        case UNEXPECTED_END_OF_FILE:
            return TY_(tidyMessageCreateWithNode)(doc, rpt, code, level, elemdesc );

        case OBSOLETE_ELEMENT:
        case REPLACING_ELEMENT:
        case REPLACING_UNEX_ELEMENT:
            return TY_(tidyMessageCreateWithNode)(doc, rpt, code, level, elemdesc, nodedesc );

        case ADDED_MISSING_CHARSET:
        case BAD_SUMMARY_HTML5:
        case NESTED_EMPHASIS:
        case PROPRIETARY_ELEMENT:
        case REMOVED_HTML5:
        case UNKNOWN_ELEMENT:
        case UNKNOWN_ELEMENT_LOOKS_CUSTOM:
            return TY_(tidyMessageCreateWithNode)(doc, rpt, code, level, nodedesc );

        case MISSING_ENDTAG_FOR:
        case MISSING_ENDTAG_OPTIONAL:
        case PREVIOUS_LOCATION:
            return TY_(tidyMessageCreateWithNode)(doc, rpt, code, level, element->element );

        case MISSING_ENDTAG_BEFORE:
            return TY_(tidyMessageCreateWithNode)(doc, rpt, code, level, element->element, nodedesc );

        case COERCE_TO_ENDTAG:
        case NON_MATCHING_ENDTAG:
        case TOO_MANY_ELEMENTS_IN:
            return TY_(tidyMessageCreateWithNode)(doc, rpt, code, level, node->element, node->element );
    }

    return NULL;
}